

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void ReadArray<aiQuatKey>(IOStream *stream,aiQuatKey *out,uint size)

{
  aiQuatKey *paVar1;
  aiQuatKey local_38;
  uint local_20;
  uint local_1c;
  uint i;
  uint size_local;
  aiQuatKey *out_local;
  IOStream *stream_local;
  
  local_1c = size;
  _i = out;
  out_local = (aiQuatKey *)stream;
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiQuatKey]");
  }
  if (out != (aiQuatKey *)0x0) {
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      Read<aiQuatKey>(&local_38,(IOStream *)out_local);
      paVar1 = _i + local_20;
      paVar1->mTime = local_38.mTime;
      (paVar1->mValue).w = local_38.mValue.w;
      (paVar1->mValue).x = local_38.mValue.x;
      (paVar1->mValue).y = local_38.mValue.y;
      (paVar1->mValue).z = local_38.mValue.z;
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiQuatKey]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}